

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

void __thiscall
ON_Xform::ON_Xform(ON_Xform *this,ON_3dPoint *P,ON_3dVector *X,ON_3dVector *Y,ON_3dVector *Z)

{
  double dVar1;
  
  dVar1 = ON_3dVector::operator[](X,0);
  this->m_xform[0][0] = dVar1;
  dVar1 = ON_3dVector::operator[](X,1);
  this->m_xform[1][0] = dVar1;
  dVar1 = ON_3dVector::operator[](X,2);
  this->m_xform[2][0] = dVar1;
  this->m_xform[3][0] = 0.0;
  dVar1 = ON_3dVector::operator[](Y,0);
  this->m_xform[0][1] = dVar1;
  dVar1 = ON_3dVector::operator[](Y,1);
  this->m_xform[1][1] = dVar1;
  dVar1 = ON_3dVector::operator[](Y,2);
  this->m_xform[2][1] = dVar1;
  this->m_xform[3][1] = 0.0;
  dVar1 = ON_3dVector::operator[](Z,0);
  this->m_xform[0][2] = dVar1;
  dVar1 = ON_3dVector::operator[](Z,1);
  this->m_xform[1][2] = dVar1;
  dVar1 = ON_3dVector::operator[](Z,2);
  this->m_xform[2][2] = dVar1;
  this->m_xform[3][2] = 0.0;
  dVar1 = ON_3dPoint::operator[](P,0);
  this->m_xform[0][3] = dVar1;
  dVar1 = ON_3dPoint::operator[](P,1);
  this->m_xform[1][3] = dVar1;
  dVar1 = ON_3dPoint::operator[](P,2);
  this->m_xform[2][3] = dVar1;
  this->m_xform[3][3] = 1.0;
  return;
}

Assistant:

ON_Xform::ON_Xform( const ON_3dPoint& P,
														 const ON_3dVector& X,
														 const ON_3dVector& Y,
														 const ON_3dVector& Z)
{
  m_xform[0][0] = X[0];
  m_xform[1][0] = X[1];
  m_xform[2][0] = X[2];
  m_xform[3][0] = 0;

  m_xform[0][1] = Y[0];
  m_xform[1][1] = Y[1];
  m_xform[2][1] = Y[2];
  m_xform[3][1] = 0;

  m_xform[0][2] = Z[0];
  m_xform[1][2] = Z[1];
  m_xform[2][2] = Z[2];
  m_xform[3][2] = 0;

  m_xform[0][3] = P[0];
  m_xform[1][3] = P[1];
  m_xform[2][3] = P[2];
  m_xform[3][3] = 1;
}